

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void StripWhiteSpace(string *str)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = (uint)str->_M_string_length;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  do {
    if (uVar7 == uVar6) {
LAB_00108d42:
      uVar5 = uVar4 - (int)uVar7;
      if (uVar5 == 0) {
        str->_M_string_length = 0;
        *(str->_M_dataplus)._M_p = '\0';
      }
      else {
        if ((int)uVar7 != 0) {
          std::__cxx11::string::erase((ulong)str,0);
          uVar4 = uVar5;
        }
        iVar1 = 0;
        uVar6 = (ulong)uVar4;
        while (-1 < (int)(uVar6 - 1)) {
          pcVar3 = (char *)std::__cxx11::string::at((ulong)str);
          iVar2 = isspace((int)*pcVar3);
          if (iVar2 == 0) {
            if (iVar1 == 0) {
              return;
            }
            std::__cxx11::string::erase((ulong)str,uVar6);
            return;
          }
          iVar1 = iVar1 + 1;
          uVar6 = uVar6 - 1;
        }
      }
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::at((ulong)str);
    iVar1 = isspace((int)*pcVar3);
    if (iVar1 == 0) {
      uVar7 = uVar6 & 0xffffffff;
      goto LAB_00108d42;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

inline void StripWhiteSpace(std::string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}